

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int g_iofile(lua_State *L,int f,char *mode)

{
  int iVar1;
  int extraout_EAX;
  char *__filename;
  FILE **ppFVar2;
  FILE *pFVar3;
  char *filename;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) goto LAB_0010f9e5;
  __filename = lua_tolstring(L,1,(size_t *)0x0);
  if (__filename == (char *)0x0) {
LAB_0010f9c3:
    tofile(L);
    lua_pushvalue(L,1);
  }
  else {
    ppFVar2 = newfile(L);
    pFVar3 = fopen(__filename,mode);
    *ppFVar2 = (FILE *)pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      fileerror(L,(int)__filename,filename);
      goto LAB_0010f9c3;
    }
  }
  lua_rawseti(L,-0x2711,f);
LAB_0010f9e5:
  lua_rawgeti(L,-0x2711,f);
  return extraout_EAX;
}

Assistant:

static int g_iofile(lua_State*L,int f,const char*mode){
if(!lua_isnoneornil(L,1)){
const char*filename=lua_tostring(L,1);
if(filename){
FILE**pf=newfile(L);
*pf=fopen(filename,mode);
if(*pf==NULL)
fileerror(L,1,filename);
}
else{
tofile(L);
lua_pushvalue(L,1);
}
lua_rawseti(L,(-10001),f);
}
lua_rawgeti(L,(-10001),f);
return 1;
}